

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O0

bool slang::ast::Lookup::ensureVisible
               (Symbol *symbol,ASTContext *context,optional<slang::SourceRange> sourceRange)

{
  bool bVar1;
  ASTContext *in_stack_00000008;
  LookupResult *in_stack_00000010;
  LookupResult result;
  LookupResult *in_stack_fffffffffffffd40;
  LookupResult *in_stack_fffffffffffffea8;
  Scope *in_stack_fffffffffffffeb0;
  Symbol *in_stack_fffffffffffffeb8;
  _Optional_payload_base<slang::SourceRange> in_stack_fffffffffffffed0;
  
  LookupResult::LookupResult(in_stack_fffffffffffffd40);
  not_null<const_slang::ast::Scope_*>::operator*((not_null<const_slang::ast::Scope_*> *)0x8ea618);
  bVar1 = anon_unknown_39::checkVisibility
                    (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                     (optional<slang::SourceRange>)in_stack_fffffffffffffed0,
                     in_stack_fffffffffffffea8);
  if (!bVar1) {
    LookupResult::reportDiags(in_stack_00000010,in_stack_00000008);
  }
  LookupResult::~LookupResult(in_stack_00000010);
  return bVar1;
}

Assistant:

bool Lookup::ensureVisible(const Symbol& symbol, const ASTContext& context,
                           std::optional<SourceRange> sourceRange) {
    LookupResult result;
    if (checkVisibility(symbol, *context.scope, sourceRange, result))
        return true;

    result.reportDiags(context);
    return false;
}